

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O3

void __thiscall
ExprFunctionAccess::ExprFunctionAccess
          (ExprFunctionAccess *this,SynBase *source,TypeBase *type,FunctionData *function,
          ExprBase *context)

{
  TypeBase *pTVar1;
  bool bVar2;
  InplaceStr local_20;
  
  (this->super_ExprBase).typeID = 0x26;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002409a0;
  this->function = function;
  this->context = context;
  if (context == (ExprBase *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3ec,
                  "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
                 );
  }
  local_20.begin = "auto ref";
  local_20.end = "";
  bVar2 = InplaceStr::operator==(&context->type->name,&local_20);
  if (!bVar2) {
    if (((function->type->super_TypeBase).isGeneric == false) &&
       (((pTVar1 = function->scope->ownerType, pTVar1 == (TypeBase *)0x0 ||
         (pTVar1->isGeneric == false)) && (function->contextType != context->type)))) {
      __assert_fail("function->contextType == context->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x3f1,
                    "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
                   );
    }
    return;
  }
  __assert_fail("context->type->name != InplaceStr(\"auto ref\")",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3ee,
                "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
               );
}

Assistant:

ExprBase(unsigned typeID, SynBase *source, TypeBase *type): typeID(typeID), source(source), type(type), next(0), listed(false)
	{
	}